

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx512::SubGridMBIntersectorKPluecker<4,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float *pfVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  ushort uVar11;
  ushort uVar12;
  Geometry *pGVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  RTCFilterFunctionN p_Var18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  float fVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  uint uVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  size_t sVar33;
  RayHitK<4> *pRVar34;
  byte bVar35;
  AABBNodeMB4D *node1;
  ulong uVar36;
  long lVar37;
  long lVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  ulong uVar43;
  long lVar44;
  long lVar45;
  ulong *puVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  long lVar52;
  ulong uVar53;
  byte bVar54;
  ulong uVar55;
  float fVar56;
  float fVar113;
  float fVar114;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar115;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar109 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  vint4 ai;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  vint4 ai_2;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar132;
  vint4 bi;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar135;
  vint4 ai_6;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  vint4 bi_2;
  undefined1 auVar141 [32];
  vint4 bi_6;
  undefined1 auVar142 [64];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [64];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar168 [64];
  RTCFilterFunctionNArguments args;
  vfloat<4> dist;
  vint<4> itime;
  vfloat<4> ftime;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_13ad;
  uint local_13ac;
  uint local_13a8;
  uint local_13a4;
  undefined1 local_13a0 [16];
  ulong local_1390;
  size_t local_1388;
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  long local_1350;
  long local_1348;
  ulong local_1340;
  ulong local_1338;
  ulong local_1330;
  ulong local_1328;
  ulong local_1320;
  ulong local_1318;
  RayHitK<4> *local_1310;
  ulong local_1308;
  ulong *local_1300;
  long local_12f8;
  long local_12f0;
  long local_12e8;
  Scene *local_12e0;
  ulong local_12d8;
  RTCFilterFunctionNArguments local_12d0;
  undefined1 local_12a0 [32];
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  undefined1 local_11a0 [16];
  undefined1 local_1190 [16];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 *local_1120;
  byte local_1118;
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  float local_10a0 [4];
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  uint uStack_1084;
  float local_1080 [4];
  float fStack_1070;
  float fStack_106c;
  float fStack_1068;
  uint uStack_1064;
  undefined1 local_1060 [32];
  float local_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined1 local_1020 [16];
  undefined1 local_1010 [16];
  undefined1 local_1000 [16];
  undefined1 local_ff0 [16];
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined1 local_fd0 [16];
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  ulong local_f90 [492];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ulong uVar42;
  undefined1 auVar108 [32];
  undefined1 auVar110 [32];
  
  puVar46 = local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar8 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1230._4_4_ = uVar8;
  local_1230._0_4_ = uVar8;
  local_1230._8_4_ = uVar8;
  local_1230._12_4_ = uVar8;
  auVar146 = ZEXT1664(local_1230);
  uVar8 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1240._4_4_ = uVar8;
  local_1240._0_4_ = uVar8;
  local_1240._8_4_ = uVar8;
  local_1240._12_4_ = uVar8;
  auVar142 = ZEXT1664(local_1240);
  uVar8 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_11e0._4_4_ = uVar8;
  local_11e0._0_4_ = uVar8;
  local_11e0._8_4_ = uVar8;
  local_11e0._12_4_ = uVar8;
  auVar162 = ZEXT1664(local_11e0);
  fVar135 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar132 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar56 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar113 = fVar135 * 0.99999964;
  local_1250._4_4_ = fVar113;
  local_1250._0_4_ = fVar113;
  local_1250._8_4_ = fVar113;
  local_1250._12_4_ = fVar113;
  auVar158 = ZEXT1664(local_1250);
  fVar113 = fVar132 * 0.99999964;
  local_1260._4_4_ = fVar113;
  local_1260._0_4_ = fVar113;
  local_1260._8_4_ = fVar113;
  local_1260._12_4_ = fVar113;
  auVar159 = ZEXT1664(local_1260);
  fVar113 = fVar56 * 0.99999964;
  local_1270._4_4_ = fVar113;
  local_1270._0_4_ = fVar113;
  local_1270._8_4_ = fVar113;
  local_1270._12_4_ = fVar113;
  auVar161 = ZEXT1664(local_1270);
  local_11f0 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar135 * 1.0000004)));
  auVar163 = ZEXT1664(local_11f0);
  local_1200 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar132 * 1.0000004)));
  auVar164 = ZEXT1664(local_1200);
  local_1210 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar56 * 1.0000004)));
  auVar165 = ZEXT1664(local_1210);
  uVar47 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar48 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar49 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar53 = uVar47 ^ 0x10;
  uVar50 = uVar48 ^ 0x10;
  auVar57 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar166 = ZEXT1664(auVar57);
  auVar58 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar167 = ZEXT1664(auVar58);
  uVar51 = uVar49 ^ 0x10;
  local_11c0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar58 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
  auVar168 = ZEXT1664(auVar58);
  local_1220 = vmovdqa64_avx512vl(auVar57);
  local_1388 = k;
  local_1340 = uVar51;
  local_1338 = uVar50;
  local_1330 = uVar53;
  local_1328 = uVar49;
  local_1320 = uVar48;
  local_1318 = uVar47;
  local_1310 = ray;
LAB_01cf0cf0:
  do {
    do {
      if (puVar46 == &local_fa0) {
        return;
      }
      pfVar7 = (float *)(puVar46 + -1);
      puVar46 = puVar46 + -2;
    } while (*(float *)(ray + k * 4 + 0x80) < *pfVar7);
    uVar55 = *puVar46;
    while( true ) {
      if ((uVar55 & 8) != 0) break;
      uVar36 = uVar55 & 0xfffffffffffffff0;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar119._4_4_ = uVar8;
      auVar119._0_4_ = uVar8;
      auVar119._8_4_ = uVar8;
      auVar119._12_4_ = uVar8;
      auVar57 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0x80 + uVar47),auVar119,
                                *(undefined1 (*) [16])(uVar36 + 0x20 + uVar47));
      auVar73 = auVar146._0_16_;
      auVar57 = vsubps_avx(auVar57,auVar73);
      auVar58 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0x80 + uVar48),auVar119,
                                *(undefined1 (*) [16])(uVar36 + 0x20 + uVar48));
      auVar127._0_4_ = auVar158._0_4_ * auVar57._0_4_;
      auVar127._4_4_ = auVar158._4_4_ * auVar57._4_4_;
      auVar127._8_4_ = auVar158._8_4_ * auVar57._8_4_;
      auVar127._12_4_ = auVar158._12_4_ * auVar57._12_4_;
      auVar74 = auVar142._0_16_;
      auVar57 = vsubps_avx(auVar58,auVar74);
      auVar58 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0x80 + uVar49),auVar119,
                                *(undefined1 (*) [16])(uVar36 + 0x20 + uVar49));
      auVar133._0_4_ = auVar159._0_4_ * auVar57._0_4_;
      auVar133._4_4_ = auVar159._4_4_ * auVar57._4_4_;
      auVar133._8_4_ = auVar159._8_4_ * auVar57._8_4_;
      auVar133._12_4_ = auVar159._12_4_ * auVar57._12_4_;
      auVar57 = vsubps_avx(auVar58,auVar162._0_16_);
      auVar136._0_4_ = auVar161._0_4_ * auVar57._0_4_;
      auVar136._4_4_ = auVar161._4_4_ * auVar57._4_4_;
      auVar136._8_4_ = auVar161._8_4_ * auVar57._8_4_;
      auVar136._12_4_ = auVar161._12_4_ * auVar57._12_4_;
      auVar57 = vmaxps_avx(auVar133,auVar136);
      auVar58 = vmaxps_avx512vl(auVar166._0_16_,auVar127);
      auVar57 = vmaxps_avx(auVar58,auVar57);
      auVar58 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0x80 + uVar53),auVar119,
                                *(undefined1 (*) [16])(uVar36 + 0x20 + uVar53));
      auVar58 = vsubps_avx(auVar58,auVar73);
      auVar59 = vmulps_avx512vl(auVar163._0_16_,auVar58);
      auVar58 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0x80 + uVar50),auVar119,
                                *(undefined1 (*) [16])(uVar36 + 0x20 + uVar50));
      auVar58 = vsubps_avx(auVar58,auVar74);
      auVar60 = vmulps_avx512vl(auVar164._0_16_,auVar58);
      auVar58 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0x80 + uVar51),auVar119,
                                *(undefined1 (*) [16])(uVar36 + 0x20 + uVar51));
      auVar58 = vsubps_avx(auVar58,auVar162._0_16_);
      auVar58 = vmulps_avx512vl(auVar165._0_16_,auVar58);
      auVar58 = vminps_avx(auVar60,auVar58);
      auVar59 = vminps_avx512vl(auVar167._0_16_,auVar59);
      auVar58 = vminps_avx(auVar59,auVar58);
      uVar26 = vcmpps_avx512vl(auVar57,auVar58,2);
      uVar39 = (uint)uVar26;
      if (((uint)uVar55 & 7) == 6) {
        uVar27 = vcmpps_avx512vl(auVar119,*(undefined1 (*) [16])(uVar36 + 0xf0),1);
        uVar28 = vcmpps_avx512vl(auVar119,*(undefined1 (*) [16])(uVar36 + 0xe0),0xd);
        uVar39 = (uint)(byte)((byte)uVar27 & (byte)uVar28 & (byte)uVar26);
      }
      local_1180._0_16_ = auVar57;
      if ((byte)uVar39 == 0) goto LAB_01cf0cf0;
      lVar37 = 0;
      for (uVar55 = (ulong)(byte)uVar39; (uVar55 & 1) == 0;
          uVar55 = uVar55 >> 1 | 0x8000000000000000) {
        lVar37 = lVar37 + 1;
      }
      uVar55 = *(ulong *)(uVar36 + lVar37 * 8);
      uVar39 = (uVar39 & 0xff) - 1 & uVar39 & 0xff;
      uVar42 = (ulong)uVar39;
      if (uVar39 != 0) {
        uVar41 = *(uint *)(local_1180 + lVar37 * 4);
        lVar37 = 0;
        for (; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
          lVar37 = lVar37 + 1;
        }
        uVar39 = uVar39 - 1 & uVar39;
        uVar43 = (ulong)uVar39;
        uVar42 = *(ulong *)(uVar36 + lVar37 * 8);
        uVar40 = *(uint *)(local_1180 + lVar37 * 4);
        if (uVar39 == 0) {
          if (uVar41 < uVar40) {
            *puVar46 = uVar42;
            *(uint *)(puVar46 + 1) = uVar40;
            puVar46 = puVar46 + 2;
          }
          else {
            *puVar46 = uVar55;
            *(uint *)(puVar46 + 1) = uVar41;
            uVar55 = uVar42;
            puVar46 = puVar46 + 2;
          }
        }
        else {
          auVar120._8_8_ = 0;
          auVar120._0_8_ = uVar55;
          auVar57 = vpunpcklqdq_avx(auVar120,ZEXT416(uVar41));
          auVar128._8_8_ = 0;
          auVar128._0_8_ = uVar42;
          auVar58 = vpunpcklqdq_avx(auVar128,ZEXT416(uVar40));
          lVar37 = 0;
          for (; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
            lVar37 = lVar37 + 1;
          }
          uVar39 = uVar39 - 1 & uVar39;
          uVar55 = (ulong)uVar39;
          auVar129._8_8_ = 0;
          auVar129._0_8_ = *(ulong *)(uVar36 + lVar37 * 8);
          auVar121 = vpunpcklqdq_avx(auVar129,ZEXT416(*(uint *)(local_1180 + lVar37 * 4)));
          auVar59 = vpshufd_avx(auVar57,0xaa);
          auVar60 = vpshufd_avx(auVar58,0xaa);
          auVar137 = vpshufd_avx(auVar121,0xaa);
          if (uVar39 == 0) {
            uVar55 = vpcmpgtd_avx512vl(auVar60,auVar59);
            uVar55 = uVar55 & 0xf;
            auVar60 = vpblendmd_avx512vl(auVar58,auVar57);
            bVar19 = (bool)((byte)uVar55 & 1);
            auVar61._0_4_ = (uint)bVar19 * auVar60._0_4_ | (uint)!bVar19 * auVar59._0_4_;
            bVar19 = (bool)((byte)(uVar55 >> 1) & 1);
            auVar61._4_4_ = (uint)bVar19 * auVar60._4_4_ | (uint)!bVar19 * auVar59._4_4_;
            bVar19 = (bool)((byte)(uVar55 >> 2) & 1);
            auVar61._8_4_ = (uint)bVar19 * auVar60._8_4_ | (uint)!bVar19 * auVar59._8_4_;
            bVar19 = SUB81(uVar55 >> 3,0);
            auVar61._12_4_ = (uint)bVar19 * auVar60._12_4_ | (uint)!bVar19 * auVar59._12_4_;
            auVar58 = vmovdqa32_avx512vl(auVar58);
            bVar19 = (bool)((byte)uVar55 & 1);
            auVar62._0_4_ = (uint)bVar19 * auVar58._0_4_ | (uint)!bVar19 * auVar57._0_4_;
            bVar19 = (bool)((byte)(uVar55 >> 1) & 1);
            auVar62._4_4_ = (uint)bVar19 * auVar58._4_4_ | (uint)!bVar19 * auVar57._4_4_;
            bVar19 = (bool)((byte)(uVar55 >> 2) & 1);
            auVar62._8_4_ = (uint)bVar19 * auVar58._8_4_ | (uint)!bVar19 * auVar57._8_4_;
            bVar19 = SUB81(uVar55 >> 3,0);
            auVar62._12_4_ = (uint)bVar19 * auVar58._12_4_ | (uint)!bVar19 * auVar57._12_4_;
            auVar57 = vpshufd_avx(auVar61,0xaa);
            uVar36 = vpcmpgtd_avx512vl(auVar137,auVar57);
            uVar36 = uVar36 & 0xf;
            auVar58 = vpblendmd_avx512vl(auVar121,auVar61);
            bVar19 = (bool)((byte)uVar36 & 1);
            bVar20 = (bool)((byte)(uVar36 >> 1) & 1);
            uVar55 = CONCAT44((uint)bVar20 * auVar58._4_4_ | (uint)!bVar20 * auVar57._4_4_,
                              (uint)bVar19 * auVar58._0_4_ | (uint)!bVar19 * auVar57._0_4_);
            auVar57 = vmovdqa32_avx512vl(auVar121);
            bVar19 = (bool)((byte)uVar36 & 1);
            auVar63._0_4_ = (uint)bVar19 * auVar57._0_4_ | !bVar19 * auVar61._0_4_;
            bVar19 = (bool)((byte)(uVar36 >> 1) & 1);
            auVar63._4_4_ = (uint)bVar19 * auVar57._4_4_ | !bVar19 * auVar61._4_4_;
            bVar19 = (bool)((byte)(uVar36 >> 2) & 1);
            auVar63._8_4_ = (uint)bVar19 * auVar57._8_4_ | !bVar19 * auVar61._8_4_;
            bVar19 = SUB81(uVar36 >> 3,0);
            auVar63._12_4_ = (uint)bVar19 * auVar57._12_4_ | !bVar19 * auVar61._12_4_;
            auVar57 = vpshufd_avx(auVar63,0xaa);
            auVar58 = vpshufd_avx(auVar62,0xaa);
            uVar36 = vpcmpgtd_avx512vl(auVar57,auVar58);
            uVar36 = uVar36 & 0xf;
            auVar58 = vpblendmd_avx512vl(auVar63,auVar62);
            bVar19 = (bool)((byte)uVar36 & 1);
            auVar64._0_4_ = (uint)bVar19 * auVar58._0_4_ | (uint)!bVar19 * auVar57._0_4_;
            bVar19 = (bool)((byte)(uVar36 >> 1) & 1);
            auVar64._4_4_ = (uint)bVar19 * auVar58._4_4_ | (uint)!bVar19 * auVar57._4_4_;
            bVar19 = (bool)((byte)(uVar36 >> 2) & 1);
            auVar64._8_4_ = (uint)bVar19 * auVar58._8_4_ | (uint)!bVar19 * auVar57._8_4_;
            bVar19 = SUB81(uVar36 >> 3,0);
            auVar64._12_4_ = (uint)bVar19 * auVar58._12_4_ | (uint)!bVar19 * auVar57._12_4_;
            auVar57 = vmovdqa32_avx512vl(auVar63);
            bVar19 = (bool)((byte)uVar36 & 1);
            bVar20 = (bool)((byte)(uVar36 >> 1) & 1);
            bVar21 = (bool)((byte)(uVar36 >> 2) & 1);
            bVar23 = SUB81(uVar36 >> 3,0);
            *(uint *)puVar46 = (uint)bVar19 * auVar57._0_4_ | !bVar19 * auVar62._0_4_;
            *(uint *)((long)puVar46 + 4) = (uint)bVar20 * auVar57._4_4_ | !bVar20 * auVar62._4_4_;
            *(uint *)(puVar46 + 1) = (uint)bVar21 * auVar57._8_4_ | !bVar21 * auVar62._8_4_;
            *(uint *)((long)puVar46 + 0xc) =
                 (uint)bVar23 * auVar57._12_4_ | !bVar23 * auVar62._12_4_;
            *(undefined1 (*) [16])(puVar46 + 2) = auVar64;
            puVar46 = puVar46 + 4;
          }
          else {
            lVar37 = 0;
            for (; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
              lVar37 = lVar37 + 1;
            }
            uVar39 = *(uint *)(local_1180 + lVar37 * 4);
            auVar143._8_8_ = 0;
            auVar143._0_8_ = *(ulong *)(uVar36 + lVar37 * 8);
            auVar122 = vpunpcklqdq_avx(auVar143,ZEXT416(uVar39));
            uVar55 = vpcmpgtd_avx512vl(auVar60,auVar59);
            uVar55 = uVar55 & 0xf;
            auVar60 = vpblendmd_avx512vl(auVar58,auVar57);
            bVar19 = (bool)((byte)uVar55 & 1);
            auVar65._0_4_ = (uint)bVar19 * auVar60._0_4_ | (uint)!bVar19 * auVar59._0_4_;
            bVar19 = (bool)((byte)(uVar55 >> 1) & 1);
            auVar65._4_4_ = (uint)bVar19 * auVar60._4_4_ | (uint)!bVar19 * auVar59._4_4_;
            bVar19 = (bool)((byte)(uVar55 >> 2) & 1);
            auVar65._8_4_ = (uint)bVar19 * auVar60._8_4_ | (uint)!bVar19 * auVar59._8_4_;
            bVar19 = SUB81(uVar55 >> 3,0);
            auVar65._12_4_ = (uint)bVar19 * auVar60._12_4_ | (uint)!bVar19 * auVar59._12_4_;
            auVar58 = vmovdqa32_avx512vl(auVar58);
            bVar19 = (bool)((byte)uVar55 & 1);
            auVar66._0_4_ = (uint)bVar19 * auVar58._0_4_ | (uint)!bVar19 * auVar57._0_4_;
            bVar19 = (bool)((byte)(uVar55 >> 1) & 1);
            auVar66._4_4_ = (uint)bVar19 * auVar58._4_4_ | (uint)!bVar19 * auVar57._4_4_;
            bVar19 = (bool)((byte)(uVar55 >> 2) & 1);
            auVar66._8_4_ = (uint)bVar19 * auVar58._8_4_ | (uint)!bVar19 * auVar57._8_4_;
            bVar19 = SUB81(uVar55 >> 3,0);
            auVar66._12_4_ = (uint)bVar19 * auVar58._12_4_ | (uint)!bVar19 * auVar57._12_4_;
            auVar134._4_4_ = uVar39;
            auVar134._0_4_ = uVar39;
            auVar134._8_4_ = uVar39;
            auVar134._12_4_ = uVar39;
            uVar55 = vpcmpgtd_avx512vl(auVar134,auVar137);
            uVar55 = uVar55 & 0xf;
            auVar57 = vpblendmd_avx512vl(auVar122,auVar121);
            bVar19 = (bool)((byte)uVar55 & 1);
            auVar67._0_4_ = (uint)bVar19 * auVar57._0_4_ | !bVar19 * uVar39;
            bVar19 = (bool)((byte)(uVar55 >> 1) & 1);
            auVar67._4_4_ = (uint)bVar19 * auVar57._4_4_ | !bVar19 * uVar39;
            bVar19 = (bool)((byte)(uVar55 >> 2) & 1);
            auVar67._8_4_ = (uint)bVar19 * auVar57._8_4_ | !bVar19 * uVar39;
            bVar19 = SUB81(uVar55 >> 3,0);
            auVar67._12_4_ = (uint)bVar19 * auVar57._12_4_ | !bVar19 * uVar39;
            auVar57 = vmovdqa32_avx512vl(auVar122);
            bVar19 = (bool)((byte)uVar55 & 1);
            auVar68._0_4_ = (uint)bVar19 * auVar57._0_4_ | (uint)!bVar19 * auVar121._0_4_;
            bVar19 = (bool)((byte)(uVar55 >> 1) & 1);
            auVar68._4_4_ = (uint)bVar19 * auVar57._4_4_ | (uint)!bVar19 * auVar121._4_4_;
            bVar19 = (bool)((byte)(uVar55 >> 2) & 1);
            auVar68._8_4_ = (uint)bVar19 * auVar57._8_4_ | (uint)!bVar19 * auVar121._8_4_;
            bVar19 = SUB81(uVar55 >> 3,0);
            auVar68._12_4_ = (uint)bVar19 * auVar57._12_4_ | (uint)!bVar19 * auVar121._12_4_;
            auVar146 = ZEXT1664(auVar73);
            auVar57 = vpshufd_avx(auVar68,0xaa);
            auVar58 = vpshufd_avx(auVar66,0xaa);
            uVar55 = vpcmpgtd_avx512vl(auVar57,auVar58);
            uVar55 = uVar55 & 0xf;
            auVar58 = vpblendmd_avx512vl(auVar68,auVar66);
            bVar19 = (bool)((byte)uVar55 & 1);
            auVar69._0_4_ = (uint)bVar19 * auVar58._0_4_ | (uint)!bVar19 * auVar57._0_4_;
            bVar19 = (bool)((byte)(uVar55 >> 1) & 1);
            auVar69._4_4_ = (uint)bVar19 * auVar58._4_4_ | (uint)!bVar19 * auVar57._4_4_;
            bVar19 = (bool)((byte)(uVar55 >> 2) & 1);
            auVar69._8_4_ = (uint)bVar19 * auVar58._8_4_ | (uint)!bVar19 * auVar57._8_4_;
            bVar19 = SUB81(uVar55 >> 3,0);
            auVar69._12_4_ = (uint)bVar19 * auVar58._12_4_ | (uint)!bVar19 * auVar57._12_4_;
            auVar59 = vmovdqa32_avx512vl(auVar68);
            bVar19 = (bool)((byte)uVar55 & 1);
            bVar21 = (bool)((byte)(uVar55 >> 1) & 1);
            bVar22 = (bool)((byte)(uVar55 >> 2) & 1);
            bVar24 = SUB81(uVar55 >> 3,0);
            auVar57 = vpshufd_avx(auVar67,0xaa);
            auVar58 = vpshufd_avx(auVar65,0xaa);
            uVar36 = vpcmpgtd_avx512vl(auVar57,auVar58);
            uVar36 = uVar36 & 0xf;
            auVar58 = vpblendmd_avx512vl(auVar67,auVar65);
            bVar20 = (bool)((byte)uVar36 & 1);
            bVar23 = (bool)((byte)(uVar36 >> 1) & 1);
            uVar55 = CONCAT44((uint)bVar23 * auVar58._4_4_ | (uint)!bVar23 * auVar57._4_4_,
                              (uint)bVar20 * auVar58._0_4_ | (uint)!bVar20 * auVar57._0_4_);
            auVar57 = vmovdqa32_avx512vl(auVar67);
            bVar20 = (bool)((byte)uVar36 & 1);
            auVar70._0_4_ = (uint)bVar20 * auVar57._0_4_ | !bVar20 * auVar65._0_4_;
            bVar20 = (bool)((byte)(uVar36 >> 1) & 1);
            auVar70._4_4_ = (uint)bVar20 * auVar57._4_4_ | !bVar20 * auVar65._4_4_;
            bVar20 = (bool)((byte)(uVar36 >> 2) & 1);
            auVar70._8_4_ = (uint)bVar20 * auVar57._8_4_ | !bVar20 * auVar65._8_4_;
            bVar20 = SUB81(uVar36 >> 3,0);
            auVar70._12_4_ = (uint)bVar20 * auVar57._12_4_ | !bVar20 * auVar65._12_4_;
            auVar57 = vpshufd_avx(auVar70,0xaa);
            auVar58 = vpshufd_avx(auVar69,0xaa);
            uVar36 = vpcmpgtd_avx512vl(auVar58,auVar57);
            uVar36 = uVar36 & 0xf;
            auVar58 = vpblendmd_avx512vl(auVar69,auVar70);
            bVar20 = (bool)((byte)uVar36 & 1);
            auVar71._0_4_ = (uint)bVar20 * auVar58._0_4_ | (uint)!bVar20 * auVar57._0_4_;
            bVar20 = (bool)((byte)(uVar36 >> 1) & 1);
            auVar71._4_4_ = (uint)bVar20 * auVar58._4_4_ | (uint)!bVar20 * auVar57._4_4_;
            bVar20 = (bool)((byte)(uVar36 >> 2) & 1);
            auVar71._8_4_ = (uint)bVar20 * auVar58._8_4_ | (uint)!bVar20 * auVar57._8_4_;
            bVar20 = SUB81(uVar36 >> 3,0);
            auVar71._12_4_ = (uint)bVar20 * auVar58._12_4_ | (uint)!bVar20 * auVar57._12_4_;
            auVar57 = vmovdqa32_avx512vl(auVar69);
            bVar20 = (bool)((byte)uVar36 & 1);
            auVar72._0_4_ = (uint)bVar20 * auVar57._0_4_ | !bVar20 * auVar70._0_4_;
            bVar20 = (bool)((byte)(uVar36 >> 1) & 1);
            auVar72._4_4_ = (uint)bVar20 * auVar57._4_4_ | !bVar20 * auVar70._4_4_;
            bVar20 = (bool)((byte)(uVar36 >> 2) & 1);
            auVar72._8_4_ = (uint)bVar20 * auVar57._8_4_ | !bVar20 * auVar70._8_4_;
            bVar20 = SUB81(uVar36 >> 3,0);
            auVar72._12_4_ = (uint)bVar20 * auVar57._12_4_ | !bVar20 * auVar70._12_4_;
            *(uint *)puVar46 = (uint)bVar19 * auVar59._0_4_ | !bVar19 * auVar66._0_4_;
            *(uint *)((long)puVar46 + 4) = (uint)bVar21 * auVar59._4_4_ | !bVar21 * auVar66._4_4_;
            *(uint *)(puVar46 + 1) = (uint)bVar22 * auVar59._8_4_ | !bVar22 * auVar66._8_4_;
            *(uint *)((long)puVar46 + 0xc) =
                 (uint)bVar24 * auVar59._12_4_ | !bVar24 * auVar66._12_4_;
            *(undefined1 (*) [16])(puVar46 + 2) = auVar72;
            *(undefined1 (*) [16])(puVar46 + 4) = auVar71;
            puVar46 = puVar46 + 6;
          }
          auVar142 = ZEXT1664(auVar74);
        }
      }
    }
    local_1350 = (ulong)((uint)uVar55 & 0xf) - 8;
    uVar55 = uVar55 & 0xfffffffffffffff0;
    local_1348 = 0;
    local_11d0 = vmovdqa64_avx512vl(auVar167._0_16_);
    local_1308 = uVar55;
    local_1300 = puVar46;
    for (; local_1348 != local_1350; local_1348 = local_1348 + 1) {
      lVar37 = local_1348 * 0x90;
      local_12f8 = uVar55 + lVar37;
      fVar135 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(uVar55 + 0x80 + lVar37)) *
                *(float *)(uVar55 + 0x84 + lVar37);
      auVar57._8_8_ = 0;
      auVar57._0_8_ = *(ulong *)(uVar55 + 0x20 + lVar37);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = *(ulong *)(uVar55 + 0x24 + lVar37);
      uVar26 = vpcmpub_avx512vl(auVar57,auVar60,2);
      auVar57 = vpmovzxbd_avx(auVar57);
      auVar57 = vcvtdq2ps_avx(auVar57);
      uVar8 = *(undefined4 *)(uVar55 + 0x44 + lVar37);
      auVar77._4_4_ = uVar8;
      auVar77._0_4_ = uVar8;
      auVar77._8_4_ = uVar8;
      auVar77._12_4_ = uVar8;
      uVar8 = *(undefined4 *)(uVar55 + 0x38 + lVar37);
      auVar79._4_4_ = uVar8;
      auVar79._0_4_ = uVar8;
      auVar79._8_4_ = uVar8;
      auVar79._12_4_ = uVar8;
      auVar58 = vfmadd213ps_fma(auVar57,auVar77,auVar79);
      auVar59._8_8_ = 0;
      auVar59._0_8_ = *(ulong *)(uVar55 + 0x50 + lVar37);
      auVar57 = vpmovzxbd_avx(auVar59);
      auVar57 = vcvtdq2ps_avx(auVar57);
      uVar8 = *(undefined4 *)(uVar55 + 0x74 + lVar37);
      auVar144._4_4_ = uVar8;
      auVar144._0_4_ = uVar8;
      auVar144._8_4_ = uVar8;
      auVar144._12_4_ = uVar8;
      uVar8 = *(undefined4 *)(uVar55 + 0x68 + lVar37);
      auVar147._4_4_ = uVar8;
      auVar147._0_4_ = uVar8;
      auVar147._8_4_ = uVar8;
      auVar147._12_4_ = uVar8;
      auVar57 = vfmadd213ps_fma(auVar57,auVar144,auVar147);
      auVar121._4_4_ = fVar135;
      auVar121._0_4_ = fVar135;
      auVar121._8_4_ = fVar135;
      auVar121._12_4_ = fVar135;
      auVar57 = vsubps_avx(auVar57,auVar58);
      auVar58 = vfmadd213ps_fma(auVar57,auVar121,auVar58);
      auVar57 = vpmovzxbd_avx(auVar60);
      auVar57 = vcvtdq2ps_avx(auVar57);
      auVar59 = vfmadd213ps_fma(auVar57,auVar77,auVar79);
      auVar74._8_8_ = 0;
      auVar74._0_8_ = *(ulong *)(uVar55 + 0x54 + lVar37);
      auVar57 = vpmovzxbd_avx(auVar74);
      auVar57 = vcvtdq2ps_avx(auVar57);
      auVar57 = vfmadd213ps_fma(auVar57,auVar144,auVar147);
      auVar57 = vsubps_avx(auVar57,auVar59);
      auVar59 = vfmadd213ps_fma(auVar57,auVar121,auVar59);
      auVar73._8_8_ = 0;
      auVar73._0_8_ = *(ulong *)(uVar55 + 0x28 + lVar37);
      auVar57 = vpmovzxbd_avx(auVar73);
      auVar57 = vcvtdq2ps_avx(auVar57);
      uVar8 = *(undefined4 *)(uVar55 + 0x48 + lVar37);
      auVar78._4_4_ = uVar8;
      auVar78._0_4_ = uVar8;
      auVar78._8_4_ = uVar8;
      auVar78._12_4_ = uVar8;
      uVar8 = *(undefined4 *)(uVar55 + 0x3c + lVar37);
      auVar80._4_4_ = uVar8;
      auVar80._0_4_ = uVar8;
      auVar80._8_4_ = uVar8;
      auVar80._12_4_ = uVar8;
      auVar60 = vfmadd213ps_fma(auVar57,auVar78,auVar80);
      auVar145._8_8_ = 0;
      auVar145._0_8_ = *(ulong *)(uVar55 + 0x58 + lVar37);
      auVar57 = vpmovzxbd_avx(auVar145);
      uVar8 = *(undefined4 *)(uVar55 + 0x78 + lVar37);
      auVar148._4_4_ = uVar8;
      auVar148._0_4_ = uVar8;
      auVar148._8_4_ = uVar8;
      auVar148._12_4_ = uVar8;
      auVar57 = vcvtdq2ps_avx(auVar57);
      uVar8 = *(undefined4 *)(uVar55 + 0x6c + lVar37);
      auVar151._4_4_ = uVar8;
      auVar151._0_4_ = uVar8;
      auVar151._8_4_ = uVar8;
      auVar151._12_4_ = uVar8;
      auVar57 = vfmadd213ps_fma(auVar57,auVar148,auVar151);
      auVar57 = vsubps_avx(auVar57,auVar60);
      auVar60 = vfmadd213ps_fma(auVar57,auVar121,auVar60);
      auVar137._8_8_ = 0;
      auVar137._0_8_ = *(ulong *)(uVar55 + 0x2c + lVar37);
      auVar57 = vpmovzxbd_avx(auVar137);
      auVar57 = vcvtdq2ps_avx(auVar57);
      auVar74 = vfmadd213ps_fma(auVar57,auVar78,auVar80);
      auVar153._8_8_ = 0;
      auVar153._0_8_ = *(ulong *)(uVar55 + 0x5c + lVar37);
      auVar57 = vpmovzxbd_avx(auVar153);
      auVar57 = vcvtdq2ps_avx(auVar57);
      auVar57 = vfmadd213ps_fma(auVar57,auVar148,auVar151);
      auVar57 = vsubps_avx(auVar57,auVar74);
      auVar74 = vfmadd213ps_fma(auVar57,auVar121,auVar74);
      auVar76._8_8_ = 0;
      auVar76._0_8_ = *(ulong *)(uVar55 + 0x30 + lVar37);
      auVar57 = vpmovzxbd_avx(auVar76);
      auVar57 = vcvtdq2ps_avx(auVar57);
      uVar8 = *(undefined4 *)(uVar55 + 0x4c + lVar37);
      auVar81._4_4_ = uVar8;
      auVar81._0_4_ = uVar8;
      auVar81._8_4_ = uVar8;
      auVar81._12_4_ = uVar8;
      uVar8 = *(undefined4 *)(uVar55 + 0x40 + lVar37);
      auVar149._4_4_ = uVar8;
      auVar149._0_4_ = uVar8;
      auVar149._8_4_ = uVar8;
      auVar149._12_4_ = uVar8;
      auVar73 = vfmadd213ps_fma(auVar57,auVar81,auVar149);
      auVar152._8_8_ = 0;
      auVar152._0_8_ = *(ulong *)(uVar55 + 0x60 + lVar37);
      auVar57 = vpmovzxbd_avx(auVar152);
      auVar57 = vcvtdq2ps_avx(auVar57);
      uVar8 = *(undefined4 *)(uVar55 + 0x7c + lVar37);
      auVar154._4_4_ = uVar8;
      auVar154._0_4_ = uVar8;
      auVar154._8_4_ = uVar8;
      auVar154._12_4_ = uVar8;
      uVar8 = *(undefined4 *)(uVar55 + 0x70 + lVar37);
      auVar155._4_4_ = uVar8;
      auVar155._0_4_ = uVar8;
      auVar155._8_4_ = uVar8;
      auVar155._12_4_ = uVar8;
      auVar57 = vfmadd213ps_fma(auVar57,auVar154,auVar155);
      auVar57 = vsubps_avx(auVar57,auVar73);
      auVar73 = vfmadd213ps_fma(auVar57,auVar121,auVar73);
      auVar75._8_8_ = 0;
      auVar75._0_8_ = *(ulong *)(uVar55 + 0x34 + lVar37);
      auVar57 = vpmovzxbd_avx(auVar75);
      auVar57 = vcvtdq2ps_avx(auVar57);
      auVar137 = vfmadd213ps_fma(auVar57,auVar81,auVar149);
      auVar82._8_8_ = 0;
      auVar82._0_8_ = *(ulong *)(uVar55 + 100 + lVar37);
      auVar57 = vpmovzxbd_avx(auVar82);
      auVar57 = vcvtdq2ps_avx(auVar57);
      auVar57 = vfmadd213ps_fma(auVar57,auVar154,auVar155);
      auVar57 = vsubps_avx(auVar57,auVar137);
      auVar137 = vfmadd213ps_fma(auVar57,auVar121,auVar137);
      auVar57 = vsubps_avx(auVar58,auVar146._0_16_);
      auVar122._0_4_ = auVar158._0_4_ * auVar57._0_4_;
      auVar122._4_4_ = auVar158._4_4_ * auVar57._4_4_;
      auVar122._8_4_ = auVar158._8_4_ * auVar57._8_4_;
      auVar122._12_4_ = auVar158._12_4_ * auVar57._12_4_;
      auVar57 = vsubps_avx(auVar60,auVar142._0_16_);
      auVar83._0_4_ = auVar159._0_4_ * auVar57._0_4_;
      auVar83._4_4_ = auVar159._4_4_ * auVar57._4_4_;
      auVar83._8_4_ = auVar159._8_4_ * auVar57._8_4_;
      auVar83._12_4_ = auVar159._12_4_ * auVar57._12_4_;
      auVar57 = vsubps_avx(auVar73,auVar162._0_16_);
      auVar73 = vmulps_avx512vl(auVar161._0_16_,auVar57);
      auVar57 = vsubps_avx(auVar59,auVar146._0_16_);
      auVar59 = vmulps_avx512vl(auVar163._0_16_,auVar57);
      auVar57 = vsubps_avx(auVar74,auVar142._0_16_);
      auVar60 = vmulps_avx512vl(auVar164._0_16_,auVar57);
      auVar57 = vsubps_avx(auVar137,auVar162._0_16_);
      auVar74 = vmulps_avx512vl(auVar165._0_16_,auVar57);
      auVar58 = vpminsd_avx(auVar122,auVar59);
      auVar57 = vpmaxsd_avx(auVar122,auVar59);
      auVar59 = vpminsd_avx(auVar83,auVar60);
      auVar58 = vpmaxsd_avx(auVar58,auVar59);
      auVar59 = vpmaxsd_avx(auVar83,auVar60);
      auVar59 = vpminsd_avx(auVar57,auVar59);
      auVar60 = vpminsd_avx(auVar73,auVar74);
      auVar57 = vpmaxsd_avx(auVar73,auVar74);
      auVar60 = vpmaxsd_avx512vl(auVar60,auVar166._0_16_);
      local_11b0 = vpmaxsd_avx(auVar58,auVar60);
      auVar57 = vpminsd_avx512vl(auVar57,auVar167._0_16_);
      auVar57 = vpminsd_avx(auVar59,auVar57);
      uVar27 = vpcmpd_avx512vl(local_11b0,auVar57,2);
      local_12d8 = CONCAT44((int)((ulong)local_12f8 >> 0x20),
                            (uint)((byte)uVar26 & 0xf & (byte)uVar27));
      while (pRVar34 = local_1310, sVar33 = local_1388, local_12d8 != 0) {
        lVar37 = 0;
        for (uVar36 = local_12d8; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
          lVar37 = lVar37 + 1;
        }
        local_12d8 = local_12d8 - 1 & local_12d8;
        fVar135 = *(float *)(ray + k * 4 + 0x80);
        if (*(float *)(local_11b0 + lVar37 * 4) <= fVar135) {
          uVar11 = *(ushort *)(local_12f8 + lVar37 * 8);
          local_13a4 = (uint)uVar11;
          uVar12 = *(ushort *)(local_12f8 + 2 + lVar37 * 8);
          uVar39 = *(uint *)(local_12f8 + 0x88);
          uVar41 = *(uint *)(local_12f8 + 4 + lVar37 * 8);
          local_1390 = (ulong)uVar41;
          local_12e0 = context->scene;
          pGVar13 = (local_12e0->geometries).items[uVar39].ptr;
          local_12e8 = *(long *)&pGVar13->field_0x58;
          fVar132 = (pGVar13->time_range).lower;
          auVar58._4_4_ = fVar132;
          auVar58._0_4_ = fVar132;
          auVar58._8_4_ = fVar132;
          auVar58._12_4_ = fVar132;
          fVar56 = pGVar13->fnumTimeSegments;
          auVar57 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar58);
          fVar132 = (pGVar13->time_range).upper - fVar132;
          auVar130._4_4_ = fVar132;
          auVar130._0_4_ = fVar132;
          auVar130._8_4_ = fVar132;
          auVar130._12_4_ = fVar132;
          auVar57 = vdivps_avx(auVar57,auVar130);
          auVar131._0_4_ = fVar56 * auVar57._0_4_;
          auVar131._4_4_ = fVar56 * auVar57._4_4_;
          auVar131._8_4_ = fVar56 * auVar57._8_4_;
          auVar131._12_4_ = fVar56 * auVar57._12_4_;
          auVar57 = vroundps_avx(auVar131,1);
          fVar56 = fVar56 + -1.0;
          auVar138._4_4_ = fVar56;
          auVar138._0_4_ = fVar56;
          auVar138._8_4_ = fVar56;
          auVar138._12_4_ = fVar56;
          auVar57 = vminps_avx(auVar57,auVar138);
          auVar137 = auVar168._0_16_;
          auVar57 = vmaxps_avx512vl(auVar57,auVar137);
          local_1190 = vsubps_avx(auVar131,auVar57);
          local_11a0 = vcvtps2dq_avx(auVar57);
          local_12f0 = pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i
                       * local_1390;
          local_13a8 = local_13a4 & 0x7fff;
          local_13ac = uVar12 & 0x7fff;
          uVar40 = *(uint *)(local_12e8 + 4 + local_12f0);
          uVar49 = (ulong)uVar40;
          uVar48 = (ulong)(uVar40 * local_13ac + *(int *)(local_12e8 + local_12f0) + local_13a8);
          lVar14 = *(long *)&pGVar13[2].numPrimitives;
          lVar52 = (long)*(int *)(local_11a0 + local_1388 * 4) * 0x38;
          lVar15 = *(long *)(lVar14 + 0x10 + lVar52);
          lVar16 = *(long *)(lVar14 + lVar52);
          auVar57 = *(undefined1 (*) [16])(lVar16 + lVar15 * uVar48);
          lVar17 = *(long *)(lVar14 + 0x48 + lVar52);
          auVar58 = *(undefined1 (*) [16])(lVar16 + (uVar48 + 1) * lVar15);
          lVar37 = uVar48 + uVar49;
          auVar59 = *(undefined1 (*) [16])(lVar16 + lVar37 * lVar15);
          lVar45 = uVar48 + uVar49 + 1;
          auVar60 = *(undefined1 (*) [16])(lVar16 + lVar45 * lVar15);
          uVar47 = (ulong)(-1 < (short)uVar11);
          lVar38 = uVar48 + uVar47 + 1;
          auVar74 = *(undefined1 (*) [16])(lVar16 + lVar38 * lVar15);
          lVar44 = uVar47 + lVar45;
          auVar73 = *(undefined1 (*) [16])(lVar16 + lVar44 * lVar15);
          uVar47 = 0;
          if (-1 < (short)uVar12) {
            uVar47 = uVar49;
          }
          auVar121 = *(undefined1 (*) [16])(lVar16 + (lVar37 + uVar47) * lVar15);
          auVar122 = *(undefined1 (*) [16])(lVar16 + (lVar45 + uVar47) * lVar15);
          auVar83 = *(undefined1 (*) [16])(lVar16 + lVar15 * (uVar47 + lVar44));
          lVar14 = *(long *)(lVar14 + 0x38 + lVar52);
          auVar75 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_1190 + local_1388 * 4)));
          auVar76 = vsubps_avx(*(undefined1 (*) [16])(lVar14 + lVar17 * uVar48),auVar57);
          auVar76 = vfmadd213ps_avx512vl(auVar76,auVar75,auVar57);
          auVar57 = vsubps_avx(*(undefined1 (*) [16])(lVar14 + lVar17 * (uVar48 + 1)),auVar58);
          auVar77 = vfmadd213ps_avx512vl(auVar57,auVar75,auVar58);
          auVar57 = vsubps_avx(*(undefined1 (*) [16])(lVar14 + lVar17 * lVar37),auVar59);
          auVar78 = vfmadd213ps_avx512vl(auVar57,auVar75,auVar59);
          auVar57 = vsubps_avx(*(undefined1 (*) [16])(lVar14 + lVar17 * lVar45),auVar60);
          auVar79 = vfmadd213ps_avx512vl(auVar57,auVar75,auVar60);
          auVar57 = vsubps_avx(*(undefined1 (*) [16])(lVar14 + lVar17 * lVar38),auVar74);
          auVar58 = vfmadd213ps_avx512vl(auVar57,auVar75,auVar74);
          auVar57 = vsubps_avx(*(undefined1 (*) [16])(lVar14 + lVar17 * lVar44),auVar73);
          auVar80 = vfmadd213ps_avx512vl(auVar57,auVar75,auVar73);
          auVar57 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar14 + lVar17 * (lVar37 + uVar47)),
                                    auVar121);
          auVar81 = vfmadd213ps_avx512vl(auVar57,auVar75,auVar121);
          auVar57 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar14 + lVar17 * (lVar45 + uVar47)),
                                    auVar122);
          auVar82 = vfmadd213ps_avx512vl(auVar57,auVar75,auVar122);
          auVar57 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar14 + (uVar47 + lVar44) * lVar17),
                                    auVar83);
          auVar83 = vfmadd213ps_avx512vl(auVar57,auVar75,auVar83);
          auVar59 = vunpcklps_avx(auVar77,auVar80);
          auVar57 = vunpckhps_avx(auVar77,auVar80);
          auVar60 = vunpcklps_avx(auVar58,auVar79);
          auVar58 = vunpckhps_avx(auVar58,auVar79);
          auVar74 = vunpcklps_avx(auVar57,auVar58);
          auVar73 = vunpcklps_avx(auVar59,auVar60);
          auVar57 = vunpckhps_avx(auVar59,auVar60);
          auVar60 = vunpcklps_avx(auVar78,auVar82);
          auVar58 = vunpckhps_avx(auVar78,auVar82);
          auVar121 = vunpcklps_avx(auVar79,auVar81);
          auVar59 = vunpckhps_avx(auVar79,auVar81);
          auVar59 = vunpcklps_avx(auVar58,auVar59);
          auVar122 = vunpcklps_avx(auVar60,auVar121);
          auVar58 = vunpckhps_avx(auVar60,auVar121);
          auVar87._16_16_ = auVar82;
          auVar87._0_16_ = auVar78;
          auVar86._16_16_ = auVar80;
          auVar86._0_16_ = auVar77;
          auVar106 = vunpcklps_avx(auVar86,auVar87);
          auVar95._16_16_ = auVar79;
          auVar95._0_16_ = auVar76;
          auVar88._16_16_ = auVar83;
          auVar88._0_16_ = auVar79;
          auVar105 = vunpcklps_avx(auVar95,auVar88);
          auVar90 = vunpcklps_avx(auVar105,auVar106);
          auVar105 = vunpckhps_avx(auVar105,auVar106);
          auVar106 = vunpckhps_avx(auVar86,auVar87);
          auVar89 = vunpckhps_avx(auVar95,auVar88);
          auVar89 = vunpcklps_avx(auVar89,auVar106);
          auVar92._16_16_ = auVar73;
          auVar92._0_16_ = auVar73;
          auVar93._16_16_ = auVar57;
          auVar93._0_16_ = auVar57;
          auVar94._16_16_ = auVar74;
          auVar94._0_16_ = auVar74;
          auVar96._16_16_ = auVar122;
          auVar96._0_16_ = auVar122;
          auVar97._16_16_ = auVar58;
          auVar97._0_16_ = auVar58;
          uVar8 = *(undefined4 *)(local_1310 + local_1388 * 4);
          auVar98._4_4_ = uVar8;
          auVar98._0_4_ = uVar8;
          auVar98._8_4_ = uVar8;
          auVar98._12_4_ = uVar8;
          auVar98._16_4_ = uVar8;
          auVar98._20_4_ = uVar8;
          auVar98._24_4_ = uVar8;
          auVar98._28_4_ = uVar8;
          auVar84 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_1310 + local_1388 * 4 + 0x10)));
          auVar85 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_1310 + local_1388 * 4 + 0x20)));
          uVar8 = *(undefined4 *)(local_1310 + local_1388 * 4 + 0x40);
          auVar150._4_4_ = uVar8;
          auVar150._0_4_ = uVar8;
          auVar150._8_4_ = uVar8;
          auVar150._12_4_ = uVar8;
          auVar150._16_4_ = uVar8;
          auVar150._20_4_ = uVar8;
          auVar150._24_4_ = uVar8;
          auVar150._28_4_ = uVar8;
          auVar86 = vinsertf32x4_avx512vl(ZEXT1632(auVar59),auVar59,1);
          uVar8 = *(undefined4 *)(local_1310 + local_1388 * 4 + 0x50);
          auVar156._4_4_ = uVar8;
          auVar156._0_4_ = uVar8;
          auVar156._8_4_ = uVar8;
          auVar156._12_4_ = uVar8;
          auVar156._16_4_ = uVar8;
          auVar156._20_4_ = uVar8;
          auVar156._24_4_ = uVar8;
          auVar156._28_4_ = uVar8;
          fVar132 = *(float *)(local_1310 + local_1388 * 4 + 0x60);
          auVar160._4_4_ = fVar132;
          auVar160._0_4_ = fVar132;
          auVar160._8_4_ = fVar132;
          auVar160._12_4_ = fVar132;
          auVar160._16_4_ = fVar132;
          auVar160._20_4_ = fVar132;
          auVar160._24_4_ = fVar132;
          auVar160._28_4_ = fVar132;
          auVar106 = vsubps_avx(auVar90,auVar98);
          auVar87 = vsubps_avx512vl(auVar105,auVar84);
          auVar88 = vsubps_avx512vl(auVar89,auVar85);
          auVar105 = vsubps_avx(auVar92,auVar98);
          auVar89 = vsubps_avx512vl(auVar93,auVar84);
          auVar90 = vsubps_avx512vl(auVar94,auVar85);
          auVar91 = vsubps_avx512vl(auVar96,auVar98);
          auVar92 = vsubps_avx512vl(auVar97,auVar84);
          auVar85 = vsubps_avx512vl(auVar86,auVar85);
          auVar86 = vsubps_avx512vl(auVar91,auVar106);
          auVar93 = vsubps_avx512vl(auVar92,auVar87);
          auVar94 = vsubps_avx512vl(auVar85,auVar88);
          auVar95 = vsubps_avx512vl(auVar106,auVar105);
          auVar96 = vsubps_avx512vl(auVar87,auVar89);
          auVar97 = vsubps_avx512vl(auVar88,auVar90);
          auVar98 = vsubps_avx512vl(auVar105,auVar91);
          auVar99 = vsubps_avx512vl(auVar89,auVar92);
          auVar100 = vsubps_avx512vl(auVar90,auVar85);
          auVar84 = vaddps_avx512vl(auVar91,auVar106);
          auVar101 = vaddps_avx512vl(auVar92,auVar87);
          auVar102 = vaddps_avx512vl(auVar85,auVar88);
          auVar103 = vmulps_avx512vl(auVar101,auVar94);
          auVar103 = vfmsub231ps_avx512vl(auVar103,auVar93,auVar102);
          auVar102 = vmulps_avx512vl(auVar102,auVar86);
          auVar102 = vfmsub231ps_avx512vl(auVar102,auVar94,auVar84);
          auVar84 = vmulps_avx512vl(auVar84,auVar93);
          auVar57 = vfmsub231ps_fma(auVar84,auVar86,auVar101);
          auVar101._0_4_ = auVar57._0_4_ * fVar132;
          auVar101._4_4_ = auVar57._4_4_ * fVar132;
          auVar101._8_4_ = auVar57._8_4_ * fVar132;
          auVar101._12_4_ = auVar57._12_4_ * fVar132;
          auVar101._16_4_ = fVar132 * 0.0;
          auVar101._20_4_ = fVar132 * 0.0;
          auVar101._24_4_ = fVar132 * 0.0;
          auVar101._28_4_ = 0;
          auVar84 = vfmadd231ps_avx512vl(auVar101,auVar156,auVar102);
          auVar101 = vfmadd231ps_avx512vl(auVar84,auVar150,auVar103);
          auVar104._0_4_ = auVar106._0_4_ + auVar105._0_4_;
          auVar104._4_4_ = auVar106._4_4_ + auVar105._4_4_;
          auVar104._8_4_ = auVar106._8_4_ + auVar105._8_4_;
          auVar104._12_4_ = auVar106._12_4_ + auVar105._12_4_;
          auVar104._16_4_ = auVar106._16_4_ + auVar105._16_4_;
          auVar104._20_4_ = auVar106._20_4_ + auVar105._20_4_;
          auVar104._24_4_ = auVar106._24_4_ + auVar105._24_4_;
          auVar104._28_4_ = auVar106._28_4_ + auVar105._28_4_;
          auVar84 = vaddps_avx512vl(auVar87,auVar89);
          auVar102 = vaddps_avx512vl(auVar88,auVar90);
          auVar103 = vmulps_avx512vl(auVar84,auVar97);
          auVar103 = vfmsub231ps_avx512vl(auVar103,auVar96,auVar102);
          auVar102 = vmulps_avx512vl(auVar102,auVar95);
          auVar102 = vfmsub231ps_avx512vl(auVar102,auVar97,auVar104);
          auVar104 = vmulps_avx512vl(auVar104,auVar96);
          auVar104 = vfmsub231ps_avx512vl(auVar104,auVar95,auVar84);
          auVar84._4_4_ = auVar104._4_4_ * fVar132;
          auVar84._0_4_ = auVar104._0_4_ * fVar132;
          auVar84._8_4_ = auVar104._8_4_ * fVar132;
          auVar84._12_4_ = auVar104._12_4_ * fVar132;
          auVar84._16_4_ = auVar104._16_4_ * fVar132;
          auVar84._20_4_ = auVar104._20_4_ * fVar132;
          auVar84._24_4_ = auVar104._24_4_ * fVar132;
          auVar84._28_4_ = auVar104._28_4_;
          auVar84 = vfmadd231ps_avx512vl(auVar84,auVar156,auVar102);
          auVar84 = vfmadd231ps_avx512vl(auVar84,auVar150,auVar103);
          auVar105 = vaddps_avx512vl(auVar105,auVar91);
          auVar89 = vaddps_avx512vl(auVar89,auVar92);
          auVar90 = vaddps_avx512vl(auVar90,auVar85);
          auVar85 = vmulps_avx512vl(auVar89,auVar100);
          auVar91 = vfmsub231ps_avx512vl(auVar85,auVar99,auVar90);
          auVar90 = vmulps_avx512vl(auVar90,auVar98);
          auVar90 = vfmsub231ps_avx512vl(auVar90,auVar100,auVar105);
          auVar85._4_4_ = auVar105._4_4_ * auVar99._4_4_;
          auVar85._0_4_ = auVar105._0_4_ * auVar99._0_4_;
          auVar85._8_4_ = auVar105._8_4_ * auVar99._8_4_;
          auVar85._12_4_ = auVar105._12_4_ * auVar99._12_4_;
          auVar85._16_4_ = auVar105._16_4_ * auVar99._16_4_;
          auVar85._20_4_ = auVar105._20_4_ * auVar99._20_4_;
          auVar85._24_4_ = auVar105._24_4_ * auVar99._24_4_;
          auVar85._28_4_ = auVar105._28_4_;
          auVar57 = vfmsub231ps_fma(auVar85,auVar98,auVar89);
          auVar105 = vmulps_avx512vl(ZEXT1632(auVar57),auVar160);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar156,auVar90);
          auVar85 = vfmadd231ps_avx512vl(auVar105,auVar150,auVar91);
          auVar91._0_4_ = auVar101._0_4_ + auVar84._0_4_;
          auVar91._4_4_ = auVar101._4_4_ + auVar84._4_4_;
          auVar91._8_4_ = auVar101._8_4_ + auVar84._8_4_;
          auVar91._12_4_ = auVar101._12_4_ + auVar84._12_4_;
          auVar91._16_4_ = auVar101._16_4_ + auVar84._16_4_;
          auVar91._20_4_ = auVar101._20_4_ + auVar84._20_4_;
          auVar91._24_4_ = auVar101._24_4_ + auVar84._24_4_;
          auVar91._28_4_ = auVar101._28_4_ + auVar84._28_4_;
          local_1140 = vaddps_avx512vl(auVar85,auVar91);
          auVar105._8_4_ = 0x7fffffff;
          auVar105._0_8_ = 0x7fffffff7fffffff;
          auVar105._12_4_ = 0x7fffffff;
          auVar105._16_4_ = 0x7fffffff;
          auVar105._20_4_ = 0x7fffffff;
          auVar105._24_4_ = 0x7fffffff;
          auVar105._28_4_ = 0x7fffffff;
          vandps_avx512vl(local_1140,auVar105);
          auVar89._8_4_ = 0x34000000;
          auVar89._0_8_ = 0x3400000034000000;
          auVar89._12_4_ = 0x34000000;
          auVar89._16_4_ = 0x34000000;
          auVar89._20_4_ = 0x34000000;
          auVar89._24_4_ = 0x34000000;
          auVar89._28_4_ = 0x34000000;
          auVar105 = vmulps_avx512vl(local_1140,auVar89);
          auVar89 = vminps_avx512vl(auVar101,auVar84);
          auVar89 = vminps_avx512vl(auVar89,auVar85);
          auVar90._8_4_ = 0x80000000;
          auVar90._0_8_ = 0x8000000080000000;
          auVar90._12_4_ = 0x80000000;
          auVar90._16_4_ = 0x80000000;
          auVar90._20_4_ = 0x80000000;
          auVar90._24_4_ = 0x80000000;
          auVar90._28_4_ = 0x80000000;
          auVar90 = vxorps_avx512vl(auVar105,auVar90);
          uVar26 = vcmpps_avx512vl(auVar89,auVar90,5);
          auVar89 = vmaxps_avx512vl(auVar101,auVar84);
          auVar89 = vmaxps_avx512vl(auVar89,auVar85);
          uVar27 = vcmpps_avx512vl(auVar89,auVar105,2);
          bVar54 = (byte)uVar26 | (byte)uVar27;
          if (bVar54 != 0) {
            auVar105 = vmulps_avx512vl(auVar96,auVar94);
            auVar89 = vmulps_avx512vl(auVar86,auVar97);
            auVar90 = vmulps_avx512vl(auVar95,auVar93);
            auVar85 = vmulps_avx512vl(auVar99,auVar97);
            auVar91 = vmulps_avx512vl(auVar95,auVar100);
            auVar92 = vmulps_avx512vl(auVar98,auVar96);
            auVar93 = vfmsub213ps_avx512vl(auVar93,auVar97,auVar105);
            auVar94 = vfmsub213ps_avx512vl(auVar94,auVar95,auVar89);
            auVar86 = vfmsub213ps_avx512vl(auVar86,auVar96,auVar90);
            auVar96 = vfmsub213ps_avx512vl(auVar100,auVar96,auVar85);
            auVar97 = vfmsub213ps_avx512vl(auVar98,auVar97,auVar91);
            auVar95 = vfmsub213ps_avx512vl(auVar99,auVar95,auVar92);
            auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar105,auVar98);
            vandps_avx512vl(auVar85,auVar98);
            uVar47 = vcmpps_avx512vl(auVar98,auVar98,1);
            vandps_avx512vl(auVar89,auVar98);
            vandps_avx512vl(auVar91,auVar98);
            uVar48 = vcmpps_avx512vl(auVar98,auVar98,1);
            vandps_avx512vl(auVar90,auVar98);
            vandps_avx512vl(auVar92,auVar98);
            uVar49 = vcmpps_avx512vl(auVar98,auVar98,1);
            bVar19 = (bool)((byte)uVar47 & 1);
            auVar102._0_4_ = (float)((uint)bVar19 * auVar93._0_4_ | (uint)!bVar19 * auVar96._0_4_);
            bVar19 = (bool)((byte)(uVar47 >> 1) & 1);
            auVar102._4_4_ = (float)((uint)bVar19 * auVar93._4_4_ | (uint)!bVar19 * auVar96._4_4_);
            bVar19 = (bool)((byte)(uVar47 >> 2) & 1);
            auVar102._8_4_ = (float)((uint)bVar19 * auVar93._8_4_ | (uint)!bVar19 * auVar96._8_4_);
            bVar19 = (bool)((byte)(uVar47 >> 3) & 1);
            auVar102._12_4_ =
                 (float)((uint)bVar19 * auVar93._12_4_ | (uint)!bVar19 * auVar96._12_4_);
            bVar19 = (bool)((byte)(uVar47 >> 4) & 1);
            auVar102._16_4_ =
                 (float)((uint)bVar19 * auVar93._16_4_ | (uint)!bVar19 * auVar96._16_4_);
            bVar19 = (bool)((byte)(uVar47 >> 5) & 1);
            auVar102._20_4_ =
                 (float)((uint)bVar19 * auVar93._20_4_ | (uint)!bVar19 * auVar96._20_4_);
            bVar19 = (bool)((byte)(uVar47 >> 6) & 1);
            auVar102._24_4_ =
                 (float)((uint)bVar19 * auVar93._24_4_ | (uint)!bVar19 * auVar96._24_4_);
            bVar19 = SUB81(uVar47 >> 7,0);
            auVar102._28_4_ = (uint)bVar19 * auVar93._28_4_ | (uint)!bVar19 * auVar96._28_4_;
            bVar19 = (bool)((byte)uVar48 & 1);
            auVar103._0_4_ = (float)((uint)bVar19 * auVar94._0_4_ | (uint)!bVar19 * auVar97._0_4_);
            bVar19 = (bool)((byte)(uVar48 >> 1) & 1);
            auVar103._4_4_ = (float)((uint)bVar19 * auVar94._4_4_ | (uint)!bVar19 * auVar97._4_4_);
            bVar19 = (bool)((byte)(uVar48 >> 2) & 1);
            auVar103._8_4_ = (float)((uint)bVar19 * auVar94._8_4_ | (uint)!bVar19 * auVar97._8_4_);
            bVar19 = (bool)((byte)(uVar48 >> 3) & 1);
            auVar103._12_4_ =
                 (float)((uint)bVar19 * auVar94._12_4_ | (uint)!bVar19 * auVar97._12_4_);
            bVar19 = (bool)((byte)(uVar48 >> 4) & 1);
            auVar103._16_4_ =
                 (float)((uint)bVar19 * auVar94._16_4_ | (uint)!bVar19 * auVar97._16_4_);
            bVar19 = (bool)((byte)(uVar48 >> 5) & 1);
            auVar103._20_4_ =
                 (float)((uint)bVar19 * auVar94._20_4_ | (uint)!bVar19 * auVar97._20_4_);
            bVar19 = (bool)((byte)(uVar48 >> 6) & 1);
            auVar103._24_4_ =
                 (float)((uint)bVar19 * auVar94._24_4_ | (uint)!bVar19 * auVar97._24_4_);
            bVar19 = SUB81(uVar48 >> 7,0);
            auVar103._28_4_ = (uint)bVar19 * auVar94._28_4_ | (uint)!bVar19 * auVar97._28_4_;
            bVar19 = (bool)((byte)uVar49 & 1);
            fVar56 = (float)((uint)bVar19 * auVar86._0_4_ | (uint)!bVar19 * auVar95._0_4_);
            bVar19 = (bool)((byte)(uVar49 >> 1) & 1);
            fVar113 = (float)((uint)bVar19 * auVar86._4_4_ | (uint)!bVar19 * auVar95._4_4_);
            bVar19 = (bool)((byte)(uVar49 >> 2) & 1);
            fVar114 = (float)((uint)bVar19 * auVar86._8_4_ | (uint)!bVar19 * auVar95._8_4_);
            bVar19 = (bool)((byte)(uVar49 >> 3) & 1);
            fVar115 = (float)((uint)bVar19 * auVar86._12_4_ | (uint)!bVar19 * auVar95._12_4_);
            bVar19 = (bool)((byte)(uVar49 >> 4) & 1);
            fVar116 = (float)((uint)bVar19 * auVar86._16_4_ | (uint)!bVar19 * auVar95._16_4_);
            bVar19 = (bool)((byte)(uVar49 >> 5) & 1);
            fVar117 = (float)((uint)bVar19 * auVar86._20_4_ | (uint)!bVar19 * auVar95._20_4_);
            bVar19 = (bool)((byte)(uVar49 >> 6) & 1);
            fVar118 = (float)((uint)bVar19 * auVar86._24_4_ | (uint)!bVar19 * auVar95._24_4_);
            bVar19 = SUB81(uVar49 >> 7,0);
            auVar100._4_4_ = fVar132 * fVar113;
            auVar100._0_4_ = fVar132 * fVar56;
            auVar100._8_4_ = fVar132 * fVar114;
            auVar100._12_4_ = fVar132 * fVar115;
            auVar100._16_4_ = fVar132 * fVar116;
            auVar100._20_4_ = fVar132 * fVar117;
            auVar100._24_4_ = fVar132 * fVar118;
            auVar100._28_4_ = fVar132;
            auVar57 = vfmadd213ps_fma(auVar156,auVar103,auVar100);
            auVar57 = vfmadd213ps_fma(auVar150,auVar102,ZEXT1632(auVar57));
            auVar89 = ZEXT1632(CONCAT412(auVar57._12_4_ + auVar57._12_4_,
                                         CONCAT48(auVar57._8_4_ + auVar57._8_4_,
                                                  CONCAT44(auVar57._4_4_ + auVar57._4_4_,
                                                           auVar57._0_4_ + auVar57._0_4_))));
            auVar157._0_4_ = auVar88._0_4_ * fVar56;
            auVar157._4_4_ = auVar88._4_4_ * fVar113;
            auVar157._8_4_ = auVar88._8_4_ * fVar114;
            auVar157._12_4_ = auVar88._12_4_ * fVar115;
            auVar157._16_4_ = auVar88._16_4_ * fVar116;
            auVar157._20_4_ = auVar88._20_4_ * fVar117;
            auVar157._24_4_ = auVar88._24_4_ * fVar118;
            auVar157._28_4_ = 0;
            auVar57 = vfmadd213ps_fma(auVar87,auVar103,auVar157);
            auVar58 = vfmadd213ps_fma(auVar106,auVar102,ZEXT1632(auVar57));
            auVar105 = vrcp14ps_avx512vl(auVar89);
            auVar106._8_4_ = 0x3f800000;
            auVar106._0_8_ = 0x3f8000003f800000;
            auVar106._12_4_ = 0x3f800000;
            auVar106._16_4_ = 0x3f800000;
            auVar106._20_4_ = 0x3f800000;
            auVar106._24_4_ = 0x3f800000;
            auVar106._28_4_ = 0x3f800000;
            auVar106 = vfnmadd213ps_avx512vl(auVar105,auVar89,auVar106);
            auVar57 = vfmadd132ps_fma(auVar106,auVar105,auVar105);
            local_12a0._28_4_ = auVar105._28_4_;
            local_12a0._0_28_ =
                 ZEXT1628(CONCAT412(auVar57._12_4_ * (auVar58._12_4_ + auVar58._12_4_),
                                    CONCAT48(auVar57._8_4_ * (auVar58._8_4_ + auVar58._8_4_),
                                             CONCAT44(auVar57._4_4_ *
                                                      (auVar58._4_4_ + auVar58._4_4_),
                                                      auVar57._0_4_ *
                                                      (auVar58._0_4_ + auVar58._0_4_)))));
            auVar142 = ZEXT3264(local_12a0);
            auVar123._4_4_ = fVar135;
            auVar123._0_4_ = fVar135;
            auVar123._8_4_ = fVar135;
            auVar123._12_4_ = fVar135;
            auVar123._16_4_ = fVar135;
            auVar123._20_4_ = fVar135;
            auVar123._24_4_ = fVar135;
            auVar123._28_4_ = fVar135;
            uVar26 = vcmpps_avx512vl(local_12a0,auVar123,2);
            uVar8 = *(undefined4 *)(local_1310 + local_1388 * 4 + 0x30);
            auVar99._4_4_ = uVar8;
            auVar99._0_4_ = uVar8;
            auVar99._8_4_ = uVar8;
            auVar99._12_4_ = uVar8;
            auVar99._16_4_ = uVar8;
            auVar99._20_4_ = uVar8;
            auVar99._24_4_ = uVar8;
            auVar99._28_4_ = uVar8;
            uVar27 = vcmpps_avx512vl(local_12a0,auVar99,0xd);
            bVar54 = (byte)uVar26 & (byte)uVar27 & bVar54;
            if (bVar54 != 0) {
              uVar47 = vcmpps_avx512vl(auVar89,_DAT_01f7b000,4);
              uVar47 = bVar54 & uVar47;
              local_1118 = (byte)uVar47;
              if (local_1118 != 0) {
                local_1120 = &local_13ad;
                local_10c0 = local_12a0;
                auVar106 = vsubps_avx(local_1140,auVar84);
                auVar106 = vblendps_avx(auVar101,auVar106,0xf0);
                auVar105 = vsubps_avx(local_1140,auVar101);
                local_1160 = vblendps_avx(auVar84,auVar105,0xf0);
                local_10a0[0] = auVar102._0_4_ * 1.0;
                local_10a0[1] = auVar102._4_4_ * 1.0;
                local_10a0[2] = auVar102._8_4_ * 1.0;
                local_10a0[3] = auVar102._12_4_ * 1.0;
                fStack_1090 = auVar102._16_4_ * -1.0;
                fStack_108c = auVar102._20_4_ * -1.0;
                fStack_1088 = auVar102._24_4_ * -1.0;
                uStack_1084 = auVar102._28_4_;
                local_1080[0] = auVar103._0_4_ * 1.0;
                local_1080[1] = auVar103._4_4_ * 1.0;
                local_1080[2] = auVar103._8_4_ * 1.0;
                local_1080[3] = auVar103._12_4_ * 1.0;
                fStack_1070 = auVar103._16_4_ * -1.0;
                fStack_106c = auVar103._20_4_ * -1.0;
                fStack_1068 = auVar103._24_4_ * -1.0;
                uStack_1064 = auVar103._28_4_;
                local_1060._4_4_ = fVar113 * 1.0;
                local_1060._0_4_ = fVar56 * 1.0;
                local_1060._8_4_ = fVar114 * 1.0;
                local_1060._12_4_ = fVar115 * 1.0;
                local_1060._16_4_ = fVar116 * -1.0;
                local_1060._20_4_ = fVar117 * -1.0;
                local_1060._24_4_ = fVar118 * -1.0;
                local_1060._28_4_ = (uint)bVar19 * auVar86._28_4_ | (uint)!bVar19 * auVar95._28_4_;
                auVar89 = vpbroadcastd_avx512vl();
                auVar105 = vpaddd_avx2(auVar89,_DAT_01fb7740);
                auVar139._0_4_ = (float)(int)(*(ushort *)(local_12e8 + 8 + local_12f0) - 1);
                auVar139._4_12_ = auVar88._4_12_;
                auVar108._16_16_ = auVar89._16_16_;
                auVar108._0_16_ = auVar137;
                auVar107._4_28_ = auVar108._4_28_;
                auVar107._0_4_ = auVar139._0_4_;
                auVar58 = vrcp14ss_avx512f(auVar137,auVar107._0_16_);
                auVar57 = vfnmadd213ss_fma(auVar58,auVar139,ZEXT416(0x40000000));
                fVar135 = auVar58._0_4_ * auVar57._0_4_;
                auVar105 = vcvtdq2ps_avx(auVar105);
                fVar117 = auVar105._28_4_ + auVar106._28_4_;
                fVar132 = (local_1140._0_4_ * auVar105._0_4_ + auVar106._0_4_) * fVar135;
                fVar56 = (local_1140._4_4_ * auVar105._4_4_ + auVar106._4_4_) * fVar135;
                local_1180._4_4_ = fVar56;
                local_1180._0_4_ = fVar132;
                fVar113 = (local_1140._8_4_ * auVar105._8_4_ + auVar106._8_4_) * fVar135;
                local_1180._8_4_ = fVar113;
                fVar114 = (local_1140._12_4_ * auVar105._12_4_ + auVar106._12_4_) * fVar135;
                local_1180._12_4_ = fVar114;
                fVar115 = (local_1140._16_4_ * auVar105._16_4_ + auVar106._16_4_) * fVar135;
                local_1180._16_4_ = fVar115;
                fVar116 = (local_1140._20_4_ * auVar105._20_4_ + auVar106._20_4_) * fVar135;
                local_1180._20_4_ = fVar116;
                fVar135 = (local_1140._24_4_ * auVar105._24_4_ + auVar106._24_4_) * fVar135;
                local_1180._24_4_ = fVar135;
                local_1180._28_4_ = fVar117;
                pGVar13 = (local_12e0->geometries).items[uVar39].ptr;
                if ((pGVar13->mask & *(uint *)(local_1310 + local_1388 * 4 + 0x90)) != 0) {
                  auVar105 = vpbroadcastd_avx512vl();
                  auVar106 = vpaddd_avx2(auVar105,_DAT_01fb7760);
                  auVar106 = vcvtdq2ps_avx(auVar106);
                  auVar140._0_4_ = (float)(int)(*(ushort *)(local_12e8 + 10 + local_12f0) - 1);
                  auVar140._4_12_ = auVar101._4_12_;
                  auVar110._16_16_ = auVar105._16_16_;
                  auVar110._0_16_ = auVar137;
                  auVar109._4_28_ = auVar110._4_28_;
                  auVar109._0_4_ = auVar140._0_4_;
                  auVar58 = vrcp14ss_avx512f(auVar137,auVar109._0_16_);
                  auVar57 = vfnmadd213ss_fma(auVar58,auVar140,ZEXT416(0x40000000));
                  fVar25 = auVar58._0_4_ * auVar57._0_4_;
                  auVar30._8_4_ = 0x219392ef;
                  auVar30._0_8_ = 0x219392ef219392ef;
                  auVar30._12_4_ = 0x219392ef;
                  auVar30._16_4_ = 0x219392ef;
                  auVar30._20_4_ = 0x219392ef;
                  auVar30._24_4_ = 0x219392ef;
                  auVar30._28_4_ = 0x219392ef;
                  uVar48 = vcmpps_avx512vl(local_1140,auVar30,5);
                  auVar105 = vrcp14ps_avx512vl(local_1140);
                  auVar141._8_4_ = 0x3f800000;
                  auVar141._0_8_ = 0x3f8000003f800000;
                  auVar141._12_4_ = 0x3f800000;
                  auVar141._16_4_ = 0x3f800000;
                  auVar141._20_4_ = 0x3f800000;
                  auVar141._24_4_ = 0x3f800000;
                  auVar141._28_4_ = 0x3f800000;
                  auVar57 = vfnmadd213ps_fma(local_1140,auVar105,auVar141);
                  auVar105 = vfmadd132ps_avx512vl(ZEXT1632(auVar57),auVar105,auVar105);
                  fVar118 = (float)((uint)((byte)uVar48 & 1) * auVar105._0_4_);
                  fVar1 = (float)((uint)((byte)(uVar48 >> 1) & 1) * auVar105._4_4_);
                  fVar2 = (float)((uint)((byte)(uVar48 >> 2) & 1) * auVar105._8_4_);
                  fVar3 = (float)((uint)((byte)(uVar48 >> 3) & 1) * auVar105._12_4_);
                  fVar4 = (float)((uint)((byte)(uVar48 >> 4) & 1) * auVar105._16_4_);
                  fVar5 = (float)((uint)((byte)(uVar48 >> 5) & 1) * auVar105._20_4_);
                  fVar6 = (float)((uint)((byte)(uVar48 >> 6) & 1) * auVar105._24_4_);
                  auVar31._4_4_ = fVar56 * fVar1;
                  auVar31._0_4_ = fVar132 * fVar118;
                  auVar31._8_4_ = fVar113 * fVar2;
                  auVar31._12_4_ = fVar114 * fVar3;
                  auVar31._16_4_ = fVar115 * fVar4;
                  auVar31._20_4_ = fVar116 * fVar5;
                  auVar31._24_4_ = fVar135 * fVar6;
                  auVar31._28_4_ = fVar117;
                  local_1100 = vminps_avx(auVar31,auVar141);
                  auVar32._4_4_ =
                       (local_1140._4_4_ * auVar106._4_4_ + local_1160._4_4_) * fVar25 * fVar1;
                  auVar32._0_4_ =
                       (local_1140._0_4_ * auVar106._0_4_ + local_1160._0_4_) * fVar25 * fVar118;
                  auVar32._8_4_ =
                       (local_1140._8_4_ * auVar106._8_4_ + local_1160._8_4_) * fVar25 * fVar2;
                  auVar32._12_4_ =
                       (local_1140._12_4_ * auVar106._12_4_ + local_1160._12_4_) * fVar25 * fVar3;
                  auVar32._16_4_ =
                       (local_1140._16_4_ * auVar106._16_4_ + local_1160._16_4_) * fVar25 * fVar4;
                  auVar32._20_4_ =
                       (local_1140._20_4_ * auVar106._20_4_ + local_1160._20_4_) * fVar25 * fVar5;
                  auVar32._24_4_ =
                       (local_1140._24_4_ * auVar106._24_4_ + local_1160._24_4_) * fVar25 * fVar6;
                  auVar32._28_4_ = auVar106._28_4_ + local_1160._28_4_;
                  local_10e0 = vminps_avx(auVar32,auVar141);
                  auVar124._8_4_ = 0x7f800000;
                  auVar124._0_8_ = 0x7f8000007f800000;
                  auVar124._12_4_ = 0x7f800000;
                  auVar124._16_4_ = 0x7f800000;
                  auVar124._20_4_ = 0x7f800000;
                  auVar124._24_4_ = 0x7f800000;
                  auVar124._28_4_ = 0x7f800000;
                  auVar106 = vblendmps_avx512vl(auVar124,local_12a0);
                  auVar111._0_4_ =
                       (uint)(local_1118 & 1) * auVar106._0_4_ |
                       (uint)!(bool)(local_1118 & 1) * 0x7f800000;
                  bVar19 = (bool)((byte)(uVar47 >> 1) & 1);
                  auVar111._4_4_ = (uint)bVar19 * auVar106._4_4_ | (uint)!bVar19 * 0x7f800000;
                  bVar19 = (bool)((byte)(uVar47 >> 2) & 1);
                  auVar111._8_4_ = (uint)bVar19 * auVar106._8_4_ | (uint)!bVar19 * 0x7f800000;
                  bVar19 = (bool)((byte)(uVar47 >> 3) & 1);
                  auVar111._12_4_ = (uint)bVar19 * auVar106._12_4_ | (uint)!bVar19 * 0x7f800000;
                  bVar19 = (bool)((byte)(uVar47 >> 4) & 1);
                  auVar111._16_4_ = (uint)bVar19 * auVar106._16_4_ | (uint)!bVar19 * 0x7f800000;
                  bVar19 = (bool)((byte)(uVar47 >> 5) & 1);
                  auVar111._20_4_ = (uint)bVar19 * auVar106._20_4_ | (uint)!bVar19 * 0x7f800000;
                  bVar19 = (bool)((byte)(uVar47 >> 6) & 1);
                  auVar111._24_4_ = (uint)bVar19 * auVar106._24_4_ | (uint)!bVar19 * 0x7f800000;
                  bVar19 = SUB81(uVar47 >> 7,0);
                  auVar111._28_4_ = (uint)bVar19 * auVar106._28_4_ | (uint)!bVar19 * 0x7f800000;
                  auVar106 = vshufps_avx(auVar111,auVar111,0xb1);
                  auVar106 = vminps_avx(auVar111,auVar106);
                  auVar105 = vshufpd_avx(auVar106,auVar106,5);
                  auVar106 = vminps_avx(auVar106,auVar105);
                  auVar105 = vpermpd_avx2(auVar106,0x4e);
                  auVar106 = vminps_avx(auVar106,auVar105);
                  uVar26 = vcmpps_avx512vl(auVar111,auVar106,0);
                  uVar40 = (uint)uVar47;
                  if ((local_1118 & (byte)uVar26) != 0) {
                    uVar40 = (uint)(local_1118 & (byte)uVar26);
                  }
                  uVar29 = 0;
                  for (; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x80000000) {
                    uVar29 = uVar29 + 1;
                  }
                  uVar48 = (ulong)uVar29;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar13->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_1370 = vpbroadcastd_avx512vl();
                    local_1380 = vpbroadcastd_avx512vl();
                    local_13a0 = ZEXT416(*(uint *)(local_1310 + local_1388 * 4 + 0x80));
                    do {
                      auVar57 = auVar168._0_16_;
                      uVar8 = *(undefined4 *)(local_1100 + uVar48 * 4);
                      local_1000._4_4_ = uVar8;
                      local_1000._0_4_ = uVar8;
                      local_1000._8_4_ = uVar8;
                      local_1000._12_4_ = uVar8;
                      uVar8 = *(undefined4 *)(local_10e0 + uVar48 * 4);
                      local_ff0._4_4_ = uVar8;
                      local_ff0._0_4_ = uVar8;
                      local_ff0._8_4_ = uVar8;
                      local_ff0._12_4_ = uVar8;
                      *(float *)(pRVar34 + sVar33 * 4 + 0x80) = local_10a0[uVar48 - 8];
                      local_12d0.context = context->user;
                      local_1030 = local_10a0[uVar48];
                      fVar135 = local_1080[uVar48];
                      local_1020._4_4_ = fVar135;
                      local_1020._0_4_ = fVar135;
                      local_1020._8_4_ = fVar135;
                      local_1020._12_4_ = fVar135;
                      uVar8 = *(undefined4 *)(local_1060 + uVar48 * 4);
                      local_1010._4_4_ = uVar8;
                      local_1010._0_4_ = uVar8;
                      local_1010._8_4_ = uVar8;
                      local_1010._12_4_ = uVar8;
                      fStack_102c = local_1030;
                      fStack_1028 = local_1030;
                      fStack_1024 = local_1030;
                      local_fe0 = local_1380._0_8_;
                      uStack_fd8 = local_1380._8_8_;
                      local_fd0 = local_1370;
                      vpcmpeqd_avx2(ZEXT1632(local_1370),ZEXT1632(local_1370));
                      uStack_fbc = (local_12d0.context)->instID[0];
                      local_fc0 = uStack_fbc;
                      uStack_fb8 = uStack_fbc;
                      uStack_fb4 = uStack_fbc;
                      uStack_fb0 = (local_12d0.context)->instPrimID[0];
                      uStack_fac = uStack_fb0;
                      uStack_fa8 = uStack_fb0;
                      uStack_fa4 = uStack_fb0;
                      local_1360 = local_11c0;
                      local_12d0.valid = (int *)local_1360;
                      local_12d0.geometryUserPtr = pGVar13->userPtr;
                      local_12d0.ray = (RTCRayN *)pRVar34;
                      local_12d0.hit = (RTCHitN *)&local_1030;
                      local_12d0.N = 4;
                      if (pGVar13->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar13->intersectionFilterN)(&local_12d0);
                        auVar142 = ZEXT3264(local_12a0);
                      }
                      uVar49 = vptestmd_avx512vl(local_1360,local_1360);
                      if ((uVar49 & 0xf) == 0) {
LAB_01cf1ee3:
                        *(undefined4 *)(pRVar34 + sVar33 * 4 + 0x80) = local_13a0._0_4_;
                      }
                      else {
                        p_Var18 = context->args->filter;
                        if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var18)(&local_12d0);
                          auVar142 = ZEXT3264(local_12a0);
                        }
                        uVar49 = vptestmd_avx512vl(local_1360,local_1360);
                        uVar49 = uVar49 & 0xf;
                        bVar54 = (byte)uVar49;
                        if (bVar54 == 0) goto LAB_01cf1ee3;
                        fVar135 = *(float *)(local_12d0.hit + 4);
                        fVar132 = *(float *)(local_12d0.hit + 8);
                        fVar56 = *(float *)(local_12d0.hit + 0xc);
                        bVar19 = (bool)((byte)(uVar49 >> 1) & 1);
                        bVar20 = (bool)((byte)(uVar49 >> 2) & 1);
                        bVar21 = SUB81(uVar49 >> 3,0);
                        *(uint *)(local_12d0.ray + 0xc0) =
                             (uint)(bVar54 & 1) * (int)*(float *)local_12d0.hit |
                             (uint)!(bool)(bVar54 & 1) * *(int *)(local_12d0.ray + 0xc0);
                        *(uint *)(local_12d0.ray + 0xc4) =
                             (uint)bVar19 * (int)fVar135 |
                             (uint)!bVar19 * *(int *)(local_12d0.ray + 0xc4);
                        *(uint *)(local_12d0.ray + 200) =
                             (uint)bVar20 * (int)fVar132 |
                             (uint)!bVar20 * *(int *)(local_12d0.ray + 200);
                        *(uint *)(local_12d0.ray + 0xcc) =
                             (uint)bVar21 * (int)fVar56 |
                             (uint)!bVar21 * *(int *)(local_12d0.ray + 0xcc);
                        fVar135 = *(float *)(local_12d0.hit + 0x14);
                        fVar132 = *(float *)(local_12d0.hit + 0x18);
                        fVar56 = *(float *)(local_12d0.hit + 0x1c);
                        bVar19 = (bool)((byte)(uVar49 >> 1) & 1);
                        bVar20 = (bool)((byte)(uVar49 >> 2) & 1);
                        bVar21 = SUB81(uVar49 >> 3,0);
                        *(uint *)(local_12d0.ray + 0xd0) =
                             (uint)(bVar54 & 1) * (int)*(float *)(local_12d0.hit + 0x10) |
                             (uint)!(bool)(bVar54 & 1) * *(int *)(local_12d0.ray + 0xd0);
                        *(uint *)(local_12d0.ray + 0xd4) =
                             (uint)bVar19 * (int)fVar135 |
                             (uint)!bVar19 * *(int *)(local_12d0.ray + 0xd4);
                        *(uint *)(local_12d0.ray + 0xd8) =
                             (uint)bVar20 * (int)fVar132 |
                             (uint)!bVar20 * *(int *)(local_12d0.ray + 0xd8);
                        *(uint *)(local_12d0.ray + 0xdc) =
                             (uint)bVar21 * (int)fVar56 |
                             (uint)!bVar21 * *(int *)(local_12d0.ray + 0xdc);
                        fVar135 = *(float *)(local_12d0.hit + 0x24);
                        fVar132 = *(float *)(local_12d0.hit + 0x28);
                        fVar56 = *(float *)(local_12d0.hit + 0x2c);
                        bVar19 = (bool)((byte)(uVar49 >> 1) & 1);
                        bVar20 = (bool)((byte)(uVar49 >> 2) & 1);
                        bVar21 = SUB81(uVar49 >> 3,0);
                        *(uint *)(local_12d0.ray + 0xe0) =
                             (uint)(bVar54 & 1) * (int)*(float *)(local_12d0.hit + 0x20) |
                             (uint)!(bool)(bVar54 & 1) * *(int *)(local_12d0.ray + 0xe0);
                        *(uint *)(local_12d0.ray + 0xe4) =
                             (uint)bVar19 * (int)fVar135 |
                             (uint)!bVar19 * *(int *)(local_12d0.ray + 0xe4);
                        *(uint *)(local_12d0.ray + 0xe8) =
                             (uint)bVar20 * (int)fVar132 |
                             (uint)!bVar20 * *(int *)(local_12d0.ray + 0xe8);
                        *(uint *)(local_12d0.ray + 0xec) =
                             (uint)bVar21 * (int)fVar56 |
                             (uint)!bVar21 * *(int *)(local_12d0.ray + 0xec);
                        fVar135 = *(float *)(local_12d0.hit + 0x34);
                        fVar132 = *(float *)(local_12d0.hit + 0x38);
                        fVar56 = *(float *)(local_12d0.hit + 0x3c);
                        bVar19 = (bool)((byte)(uVar49 >> 1) & 1);
                        bVar20 = (bool)((byte)(uVar49 >> 2) & 1);
                        bVar21 = SUB81(uVar49 >> 3,0);
                        *(uint *)(local_12d0.ray + 0xf0) =
                             (uint)(bVar54 & 1) * (int)*(float *)(local_12d0.hit + 0x30) |
                             (uint)!(bool)(bVar54 & 1) * *(int *)(local_12d0.ray + 0xf0);
                        *(uint *)(local_12d0.ray + 0xf4) =
                             (uint)bVar19 * (int)fVar135 |
                             (uint)!bVar19 * *(int *)(local_12d0.ray + 0xf4);
                        *(uint *)(local_12d0.ray + 0xf8) =
                             (uint)bVar20 * (int)fVar132 |
                             (uint)!bVar20 * *(int *)(local_12d0.ray + 0xf8);
                        *(uint *)(local_12d0.ray + 0xfc) =
                             (uint)bVar21 * (int)fVar56 |
                             (uint)!bVar21 * *(int *)(local_12d0.ray + 0xfc);
                        fVar135 = *(float *)(local_12d0.hit + 0x44);
                        fVar132 = *(float *)(local_12d0.hit + 0x48);
                        fVar56 = *(float *)(local_12d0.hit + 0x4c);
                        bVar19 = (bool)((byte)(uVar49 >> 1) & 1);
                        bVar20 = (bool)((byte)(uVar49 >> 2) & 1);
                        bVar21 = SUB81(uVar49 >> 3,0);
                        *(uint *)(local_12d0.ray + 0x100) =
                             (uint)(bVar54 & 1) * (int)*(float *)(local_12d0.hit + 0x40) |
                             (uint)!(bool)(bVar54 & 1) * *(int *)(local_12d0.ray + 0x100);
                        *(uint *)(local_12d0.ray + 0x104) =
                             (uint)bVar19 * (int)fVar135 |
                             (uint)!bVar19 * *(int *)(local_12d0.ray + 0x104);
                        *(uint *)(local_12d0.ray + 0x108) =
                             (uint)bVar20 * (int)fVar132 |
                             (uint)!bVar20 * *(int *)(local_12d0.ray + 0x108);
                        *(uint *)(local_12d0.ray + 0x10c) =
                             (uint)bVar21 * (int)fVar56 |
                             (uint)!bVar21 * *(int *)(local_12d0.ray + 0x10c);
                        auVar58 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_12d0.hit + 0x50));
                        *(undefined1 (*) [16])(local_12d0.ray + 0x110) = auVar58;
                        auVar58 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_12d0.hit + 0x60));
                        *(undefined1 (*) [16])(local_12d0.ray + 0x120) = auVar58;
                        auVar58 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_12d0.hit + 0x70));
                        *(undefined1 (*) [16])(local_12d0.ray + 0x130) = auVar58;
                        auVar58 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_12d0.hit + 0x80));
                        *(undefined1 (*) [16])(local_12d0.ray + 0x140) = auVar58;
                        local_13a0._0_4_ = *(undefined4 *)(pRVar34 + sVar33 * 4 + 0x80);
                        local_13a0._4_4_ = 0;
                        local_13a0._8_4_ = 0;
                        local_13a0._12_4_ = 0;
                      }
                      auVar57 = vxorps_avx512vl(auVar57,auVar57);
                      auVar168 = ZEXT1664(auVar57);
                      bVar54 = ~(byte)(1 << ((uint)uVar48 & 0x1f)) & (byte)uVar47;
                      auVar125._4_4_ = local_13a0._0_4_;
                      auVar125._0_4_ = local_13a0._0_4_;
                      auVar125._8_4_ = local_13a0._0_4_;
                      auVar125._12_4_ = local_13a0._0_4_;
                      auVar125._16_4_ = local_13a0._0_4_;
                      auVar125._20_4_ = local_13a0._0_4_;
                      auVar125._24_4_ = local_13a0._0_4_;
                      auVar125._28_4_ = local_13a0._0_4_;
                      uVar26 = vcmpps_avx512vl(auVar142._0_32_,auVar125,2);
                      if ((bVar54 & (byte)uVar26) == 0) goto LAB_01cf1c0b;
                      bVar54 = bVar54 & (byte)uVar26;
                      uVar47 = (ulong)bVar54;
                      auVar126._8_4_ = 0x7f800000;
                      auVar126._0_8_ = 0x7f8000007f800000;
                      auVar126._12_4_ = 0x7f800000;
                      auVar126._16_4_ = 0x7f800000;
                      auVar126._20_4_ = 0x7f800000;
                      auVar126._24_4_ = 0x7f800000;
                      auVar126._28_4_ = 0x7f800000;
                      auVar106 = vblendmps_avx512vl(auVar126,auVar142._0_32_);
                      auVar112._0_4_ =
                           (uint)(bVar54 & 1) * auVar106._0_4_ |
                           (uint)!(bool)(bVar54 & 1) * 0x7f800000;
                      bVar19 = (bool)(bVar54 >> 1 & 1);
                      auVar112._4_4_ = (uint)bVar19 * auVar106._4_4_ | (uint)!bVar19 * 0x7f800000;
                      bVar19 = (bool)(bVar54 >> 2 & 1);
                      auVar112._8_4_ = (uint)bVar19 * auVar106._8_4_ | (uint)!bVar19 * 0x7f800000;
                      bVar19 = (bool)(bVar54 >> 3 & 1);
                      auVar112._12_4_ = (uint)bVar19 * auVar106._12_4_ | (uint)!bVar19 * 0x7f800000;
                      bVar19 = (bool)(bVar54 >> 4 & 1);
                      auVar112._16_4_ = (uint)bVar19 * auVar106._16_4_ | (uint)!bVar19 * 0x7f800000;
                      bVar19 = (bool)(bVar54 >> 5 & 1);
                      auVar112._20_4_ = (uint)bVar19 * auVar106._20_4_ | (uint)!bVar19 * 0x7f800000;
                      bVar19 = (bool)(bVar54 >> 6 & 1);
                      auVar112._24_4_ = (uint)bVar19 * auVar106._24_4_ | (uint)!bVar19 * 0x7f800000;
                      auVar112._28_4_ =
                           (uint)(bVar54 >> 7) * auVar106._28_4_ |
                           (uint)!(bool)(bVar54 >> 7) * 0x7f800000;
                      auVar106 = vshufps_avx(auVar112,auVar112,0xb1);
                      auVar106 = vminps_avx(auVar112,auVar106);
                      auVar105 = vshufpd_avx(auVar106,auVar106,5);
                      auVar106 = vminps_avx(auVar106,auVar105);
                      auVar105 = vpermpd_avx2(auVar106,0x4e);
                      auVar106 = vminps_avx(auVar106,auVar105);
                      uVar26 = vcmpps_avx512vl(auVar112,auVar106,0);
                      bVar35 = (byte)uVar26 & bVar54;
                      if (bVar35 != 0) {
                        bVar54 = bVar35;
                      }
                      uVar39 = 0;
                      for (uVar41 = (uint)bVar54; (uVar41 & 1) == 0;
                          uVar41 = uVar41 >> 1 | 0x80000000) {
                        uVar39 = uVar39 + 1;
                      }
                      uVar48 = (ulong)uVar39;
                    } while( true );
                  }
                  uVar8 = *(undefined4 *)(local_1100 + uVar48 * 4);
                  uVar9 = *(undefined4 *)(local_10e0 + uVar48 * 4);
                  fVar135 = local_10a0[uVar48];
                  fVar132 = local_1080[uVar48];
                  uVar10 = *(undefined4 *)(local_1060 + uVar48 * 4);
                  *(float *)(local_1310 + local_1388 * 4 + 0x80) = local_10a0[uVar48 - 8];
                  *(float *)(local_1310 + local_1388 * 4 + 0xc0) = fVar135;
                  *(float *)(local_1310 + local_1388 * 4 + 0xd0) = fVar132;
                  *(undefined4 *)(local_1310 + local_1388 * 4 + 0xe0) = uVar10;
                  *(undefined4 *)(local_1310 + local_1388 * 4 + 0xf0) = uVar8;
                  *(undefined4 *)(local_1310 + local_1388 * 4 + 0x100) = uVar9;
                  *(uint *)(local_1310 + local_1388 * 4 + 0x110) = uVar41;
                  *(uint *)(local_1310 + local_1388 * 4 + 0x120) = uVar39;
                  *(uint *)(local_1310 + local_1388 * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(local_1310 + local_1388 * 4 + 0x140) = context->user->instPrimID[0];
                }
              }
            }
          }
LAB_01cf1c0b:
          auVar162 = ZEXT1664(local_11e0);
          auVar163 = ZEXT1664(local_11f0);
          auVar164 = ZEXT1664(local_1200);
          auVar165 = ZEXT1664(local_1210);
          auVar166 = ZEXT1664(local_1220);
          auVar167 = ZEXT1664(local_11d0);
          ray = pRVar34;
          uVar55 = local_1308;
          puVar46 = local_1300;
          uVar47 = local_1318;
          uVar48 = local_1320;
          uVar49 = local_1328;
          uVar50 = local_1338;
          uVar51 = local_1340;
          uVar53 = local_1330;
          k = sVar33;
        }
      }
      auVar146 = ZEXT1664(local_1230);
      auVar142 = ZEXT1664(local_1240);
      auVar158 = ZEXT1664(local_1250);
      auVar159 = ZEXT1664(local_1260);
      auVar161 = ZEXT1664(local_1270);
    }
    auVar57 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
    auVar167 = ZEXT1664(auVar57);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }